

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::coap::Coap::AddResource
          (Error *__return_storage_ptr__,Coap *this,Resource *aResource)

{
  iterator iVar1;
  char *begin;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string local_a0;
  undefined1 local_80 [40];
  pointer local_58;
  char *pcStack_50;
  size_t local_48;
  undefined8 local_40;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  code *local_30;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ot::commissioner::coap::Resource>_>_>
          ::find(&(this->mResources)._M_t,&aResource->mUriPath);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->mResources)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ot::commissioner::coap::Resource>,std::_Select1st<std::pair<std::__cxx11::string_const,ot::commissioner::coap::Resource>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ot::commissioner::coap::Resource>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,ot::commissioner::coap::Resource_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ot::commissioner::coap::Resource>,std::_Select1st<std::pair<std::__cxx11::string_const,ot::commissioner::coap::Resource>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ot::commissioner::coap::Resource>>>
                *)&this->mResources,&aResource->mUriPath,aResource);
  }
  else {
    local_58 = (pointer)CONCAT44(local_58._4_4_,string_type);
    pcStack_50 = "CoAP resource {} already exists";
    local_48 = 0x1f;
    local_40._0_4_ = 0;
    local_40._4_4_ = 1;
    local_30 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar2 = "CoAP resource {} already exists";
    local_38 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_58;
    while (begin = pcVar2, begin != "") {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_58);
      }
    }
    local_58 = (aResource->mUriPath)._M_dataplus._M_p;
    pcStack_50 = (char *)(aResource->mUriPath)._M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x1f;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_(&local_a0,(v10 *)"CoAP resource {} already exists",fmt,args);
    local_80._0_4_ = kAlreadyExists;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_a0);
    Error::operator=(__return_storage_ptr__,(Error *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Coap::AddResource(const Resource &aResource)
{
    Error error;
    auto  res = mResources.find(aResource.GetUriPath());

    if (res != mResources.end())
    {
        ExitNow(error = ERROR_ALREADY_EXISTS("CoAP resource {} already exists", aResource.GetUriPath()));
    }
    mResources.emplace(aResource.GetUriPath(), aResource);

exit:
    return error;
}